

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fec-pkt.c
# Opt level: O2

void fec_pkt_init(fec_pkt_t *pkt)

{
  if (pkt != (fec_pkt_t *)0x0) {
    (pkt->hdr).magic = 0xfe;
    (pkt->hdr).version = '\x01';
    (pkt->hdr).len = 0;
    (pkt->hdr).group_seq = '\0';
    pkt->payload = pkt->data + 0xe;
    return;
  }
  __assert_fail("pkt != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec-pkt.c",0x18,
                "void fec_pkt_init(fec_pkt_t *)");
}

Assistant:

void fec_pkt_init(fec_pkt_t *pkt) {
  assert(pkt != NULL);

  pkt->hdr.magic = FEC_PKT_MAGIC;
  pkt->hdr.version = 1;
  pkt->hdr.len = 0;
  pkt->hdr.group_seq = 0;
  pkt->payload = pkt->data + FEC_PKT_HDR_SIZE;
}